

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O1

void __thiscall tcu::DirArchive::DirArchive(DirArchive *this,char *path)

{
  string *this_00;
  size_type sVar1;
  allocator<char> local_11;
  
  (this->super_Archive)._vptr_Archive = (_func_int **)&PTR__DirArchive_007a08d0;
  this_00 = &this->m_path;
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,path,&local_11);
  sVar1 = (this->m_path)._M_string_length;
  if ((sVar1 != 0) && ((this_00->_M_dataplus)._M_p[sVar1 - 1] != '/')) {
    std::__cxx11::string::append((char *)this_00);
  }
  return;
}

Assistant:

DirArchive::DirArchive (const char* path)
	: m_path(path)
{
	// Append leading / if necessary
	if (m_path.length() > 0 && m_path[m_path.length()-1] != '/')
		m_path += "/";
}